

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_common.h
# Opt level: O0

void VP8LPrefixEncode(int distance,int *code,int *extra_bits,int *extra_bits_value)

{
  VP8LPrefixCode VVar1;
  uint *in_RCX;
  int *in_RDX;
  int *in_RSI;
  int in_EDI;
  VP8LPrefixCode prefix_code;
  int unaff_retaddr;
  char local_22;
  char cStack_21;
  undefined4 in_stack_fffffffffffffff8;
  
  if (in_EDI < 0x200) {
    VVar1 = kPrefixEncodeCode[in_EDI];
    local_22 = VVar1.code_;
    *in_RSI = (int)local_22;
    cStack_21 = VVar1.extra_bits_;
    *in_RDX = (int)cStack_21;
    *in_RCX = (uint)""[in_EDI];
  }
  else {
    VP8LPrefixEncodeNoLUT
              (unaff_retaddr,(int *)CONCAT44(in_EDI,in_stack_fffffffffffffff8),in_RSI,in_RDX);
  }
  return;
}

Assistant:

static WEBP_INLINE void VP8LPrefixEncode(int distance, int* const code,
                                         int* const extra_bits,
                                         int* const extra_bits_value) {
  if (distance < PREFIX_LOOKUP_IDX_MAX) {
    const VP8LPrefixCode prefix_code = kPrefixEncodeCode[distance];
    *code = prefix_code.code_;
    *extra_bits = prefix_code.extra_bits_;
    *extra_bits_value = kPrefixEncodeExtraBitsValue[distance];
  } else {
    VP8LPrefixEncodeNoLUT(distance, code, extra_bits, extra_bits_value);
  }
}